

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

wchar_t parse__escape(wchar_t **ptr)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  long lVar3;
  wchar_t wVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t hex [17];
  
  pwVar2 = *ptr;
  wVar4 = pwVar2[1];
  if (wVar4 == L'\0') {
    return L'\xffffffff';
  }
  pwVar1 = pwVar2 + 1;
  wVar6 = *pwVar2;
  pwVar5 = pwVar1;
  if (wVar6 == L'^') {
    wVar6 = L'\x7f';
    if (wVar4 != L'?') {
      wVar6 = wVar4 & 0x9f;
    }
  }
  else {
    pwVar5 = pwVar2;
    if (wVar6 == L'\\') {
      if ((uint)(wVar4 + L'\xffffffd0') < 8) {
        pwVar1 = pwVar2 + 4;
        wVar6 = L'\0';
        for (lVar3 = 4; (int)lVar3 != 0x10; lVar3 = lVar3 + 4) {
          if (*(int *)((long)pwVar2 + lVar3) - 0x38U < 0xfffffff8) {
            pwVar1 = (wchar_t *)((long)pwVar2 + lVar3);
            break;
          }
          wVar6 = *(int *)((long)pwVar2 + lVar3) + wVar6 * 8 + L'\xffffffd0';
        }
        if (0xff < (uint)wVar6) {
          return L'\xffffffff';
        }
        pwVar5 = pwVar1 + -1;
      }
      else {
        pwVar5 = pwVar1;
        wVar6 = wVar4;
        switch(wVar4) {
        case L'a':
          wVar6 = L'\a';
          break;
        case L'b':
          wVar6 = L'\b';
          break;
        case L'c':
        case L'd':
          break;
        case L'e':
          wVar6 = L'\x1b';
          break;
        case L'f':
          wVar6 = L'\f';
          break;
        default:
          switch(wVar4) {
          case L'n':
            wVar6 = L'\n';
            break;
          case L'o':
          case L'p':
          case L'q':
          case L's':
          case L'u':
            break;
          case L'r':
            wVar6 = L'\r';
            break;
          case L't':
            wVar6 = L'\t';
            break;
          case L'v':
            wVar6 = L'\v';
            break;
          default:
            if (wVar4 == L'U') {
              pwVar1 = L"0123456789ABCDEF";
              pwVar5 = hex;
              for (lVar3 = 0x44; lVar3 != 0; lVar3 = lVar3 + -1) {
                *(char *)pwVar5 = (char)*pwVar1;
                pwVar1 = (wchar_t *)((long)pwVar1 + 1);
                pwVar5 = (wchar_t *)((long)pwVar5 + 1);
              }
              if (pwVar2[2] != L'+') {
                return L'\xffffffff';
              }
              pwVar5 = pwVar2 + 3;
              iVar7 = 5;
              wVar6 = L'\0';
              while (iVar7 != 0) {
                pwVar2 = wcschr(hex,*pwVar5);
                if ((iVar7 != 1) && (pwVar2 == (wchar_t *)0x0)) {
                  return L'\xffffffff';
                }
                wVar4 = (uint)((ulong)((long)pwVar2 - (long)hex) >> 2) | wVar6 << 4;
                if (pwVar2 == (wchar_t *)0x0) {
                  wVar4 = wVar6;
                }
                pwVar5 = pwVar5 + (pwVar2 != (wchar_t *)0x0);
                iVar7 = iVar7 + -1;
                wVar6 = wVar4;
              }
              if (0x10ffff < (uint)wVar6) {
                return L'\xffffffff';
              }
            }
          }
        }
      }
    }
  }
  *ptr = pwVar5 + 1;
  return wVar6;
}

Assistant:

libedit_private int
parse__escape(const wchar_t **ptr)
{
	const wchar_t *p;
	wint_t c;

	p = *ptr;

	if (p[1] == 0)
		return -1;

	if (*p == '\\') {
		p++;
		switch (*p) {
		case 'a':
			c = '\007';	/* Bell */
			break;
		case 'b':
			c = '\010';	/* Backspace */
			break;
		case 't':
			c = '\011';	/* Horizontal Tab */
			break;
		case 'n':
			c = '\012';	/* New Line */
			break;
		case 'v':
			c = '\013';	/* Vertical Tab */
			break;
		case 'f':
			c = '\014';	/* Form Feed */
			break;
		case 'r':
			c = '\015';	/* Carriage Return */
			break;
		case 'e':
			c = '\033';	/* Escape */
			break;
		case 'U':		/* Unicode \U+xxxx or \U+xxxxx format */
		{
			int i;
			const wchar_t hex[] = L"0123456789ABCDEF";
			const wchar_t *h;
			++p;
			if (*p++ != '+')
				return -1;
			c = 0;
			for (i = 0; i < 5; ++i) {
				h = wcschr(hex, *p++);
				if (!h && i < 4)
					return -1;
				else if (h)
					c = (c << 4) | ((int)(h - hex));
				else
					--p;
			}
			if (c > 0x10FFFF) /* outside valid character range */
				return -1;
			break;
		}
		case '0':
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		{
			int cnt, ch;

			for (cnt = 0, c = 0; cnt < 3; cnt++) {
				ch = *p++;
				if (ch < '0' || ch > '7') {
					p--;
					break;
				}
				c = (c << 3) | (ch - '0');
			}
			if ((c & (wint_t)0xffffff00) != (wint_t)0)
				return -1;
			--p;
			break;
		}
		default:
			c = *p;
			break;
		}
	} else if (*p == '^') {
		p++;
		c = (*p == '?') ? '\177' : (*p & 0237);
	} else
		c = *p;
	*ptr = ++p;
	return c;
}